

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

void __thiscall wasm::I64ToI32Lowering::visitDrop(I64ToI32Lowering *this,Drop *curr)

{
  iterator iVar1;
  TempVar local_40;
  Expression *local_20;
  
  local_20 = curr->value;
  iVar1 = std::
          _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->highBitVars)._M_h,&local_20);
  if (iVar1.
      super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_false>
      ._M_cur != (__node_type *)0x0) {
    fetchOutParam(&local_40,this,curr->value);
    TempVar::~TempVar(&local_40);
  }
  return;
}

Assistant:

void visitDrop(Drop* curr) {
    if (!hasOutParam(curr->value)) {
      return;
    }
    // free temp var
    fetchOutParam(curr->value);
  }